

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::ParseVOffset(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar5 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar5) {
    state_local._7_1_ = false;
  }
  else {
    iVar1 = ((guard.state_)->parse_state).mangled_idx;
    iVar2 = ((guard.state_)->parse_state).out_cur_idx;
    iVar3 = ((guard.state_)->parse_state).prev_name_idx;
    uVar4 = *(undefined4 *)&((guard.state_)->parse_state).field_0xc;
    bVar5 = ParseNumber(guard.state_,(int *)0x0);
    if (((bVar5) && (bVar5 = ParseOneCharToken(guard.state_,'_'), bVar5)) &&
       (bVar5 = ParseNumber(guard.state_,(int *)0x0), bVar5)) {
      state_local._7_1_ = true;
    }
    else {
      ((guard.state_)->parse_state).mangled_idx = iVar1;
      ((guard.state_)->parse_state).out_cur_idx = iVar2;
      ((guard.state_)->parse_state).prev_name_idx = iVar3;
      *(undefined4 *)&((guard.state_)->parse_state).field_0xc = uVar4;
      state_local._7_1_ = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseVOffset(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;
  if (ParseNumber(state, nullptr) && ParseOneCharToken(state, '_') &&
      ParseNumber(state, nullptr)) {
    return true;
  }
  state->parse_state = copy;
  return false;
}